

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tn93_shared.cc
# Opt level: O1

int readFASTA(FILE *F,char *automatonState,StringBuffer *names,StringBuffer *sequences,
             Vector *nameLengths,Vector *seqLengths,long *firstSequenceLength,bool oneByOne,
             Vector *sequenceInstances,char sep,double include_prob,bool progress)

{
  char cVar1;
  StringBuffer *this;
  uint __c;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ostream *poVar7;
  ulong uVar8;
  unsigned_long uVar9;
  string *psVar10;
  size_t sVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  double dVar15;
  time_t after;
  time_t before;
  string err;
  time_t local_150;
  time_t local_148;
  long local_140;
  char local_138 [264];
  
  if (oneByOne) {
    StringBuffer::resetString(sequences);
    StringBuffer::resetString(names);
    include_prob = 1.0;
  }
  uVar4 = (ulong)(include_prob * 4294967295.0);
  uVar5 = 0;
  if (include_prob < 1.0) {
    uVar5 = (long)(include_prob * 4294967295.0 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f |
            uVar4;
  }
  if (progress) {
    time(&local_148);
  }
  flockfile((FILE *)F);
  bVar14 = true;
  uVar4 = 0;
  do {
    __c = getc_unlocked((FILE *)F);
    iVar2 = feof_unlocked((FILE *)F);
    iVar3 = 3;
    if (iVar2 == 0) {
      cVar1 = *automatonState;
      iVar2 = 0;
      iVar3 = iVar2;
      if (cVar1 == '\x02') {
        iVar2 = toupper(__c);
        __c = (uint)(byte)validFlags[iVar2];
        this = sequences;
        if (validFlags[iVar2] < '\0') {
          if ((iVar2 == 0x3e) || (iVar2 == 0x23)) {
            *automatonState = '\x01';
            if (bVar14) {
              if (oneByOne) {
                if (*firstSequenceLength == 0) {
                  *firstSequenceLength = sequences->sLength - 1;
                }
                *automatonState = '\0';
                StringBuffer::appendChar(sequences,'\0');
                ungetc(iVar2,(FILE *)F);
                funlockfile((FILE *)F);
                iVar3 = 1;
                goto LAB_00108763;
              }
              addASequenceToList(sequences,seqLengths,firstSequenceLength,names,nameLengths);
              uVar4 = uVar4 + 1;
              if ((progress) && ((uVar4 & 0x3ff) == 0)) {
                time(&local_150);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\bProgress:"
                           ,0x5f);
                *(undefined8 *)(std::ios_base::Init::~Init + *(long *)(std::cerr + -0x18)) = 8;
                poVar7 = std::ostream::_M_insert<long>((long)&std::cerr);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7," sequences read (",0x11);
                lVar6 = *(long *)poVar7;
                *(undefined8 *)(poVar7 + *(long *)(lVar6 + -0x18) + 0x10) = 0xc;
                *(undefined8 *)(poVar7 + *(long *)(lVar6 + -0x18) + 8) = 3;
                dVar15 = difftime(local_150,local_148);
                poVar7 = std::ostream::_M_insert<double>((double)(long)uVar4 / dVar15);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7," seqs/sec)",10);
                local_150 = local_148;
              }
            }
            bVar14 = true;
            goto LAB_00108b57;
          }
        }
        else {
joined_r0x0010880b:
          if (bVar14) {
            StringBuffer::appendChar(this,(char)__c);
          }
        }
      }
      else if (cVar1 == '\x01') {
        if ((__c != 0xd) && (this = names, __c != 10)) goto joined_r0x0010880b;
        if (bVar14) {
          StringBuffer::appendChar(names,'\0');
          if (oneByOne) {
            lVar6 = names->sLength - 1;
          }
          else {
            Vector::appendValue(nameLengths,names->sLength);
            lVar6 = stringLength(nameLengths,nameLengths->vLength - 2);
          }
          if (lVar6 < 1) {
            psVar10 = (string *)__cxa_allocate_exception(0x20);
            *(string **)psVar10 = psVar10 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      (psVar10,"Sequence names must be non-empty.","");
            __cxa_throw(psVar10,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          *automatonState = '\x02';
          if (sequenceInstances != (Vector *)0x0) {
            lVar12 = 1;
            if (2 < lVar6) {
              lVar12 = 0;
              do {
                if (names->sData[lVar12 + (names->sLength - 3)] == sep) {
                  iVar3 = atoi(names->sData + lVar12 + names->sLength + -2);
                  lVar6 = (long)iVar3;
                  goto LAB_00108a64;
                }
                lVar12 = lVar12 + -1;
              } while (2 - lVar6 != lVar12);
              lVar6 = 1;
LAB_00108a64:
              lVar13 = lVar6 + (ulong)(lVar6 == 0);
              local_140 = lVar13;
              if (include_prob < 1.0) {
                lVar6 = lVar6 + (ulong)(lVar6 == 0);
                lVar13 = 0;
                do {
                  uVar9 = genrand_int32();
                  lVar13 = lVar13 + (ulong)(uVar9 < uVar5);
                  lVar6 = lVar6 + -1;
                } while (lVar6 != 0);
              }
              iVar3 = 0;
              lVar12 = lVar13;
              if (lVar13 == 0) {
                if (oneByOne) {
                  StringBuffer::resetString(names);
                }
                else {
                  uVar8 = Vector::value(nameLengths,nameLengths->vLength - 2);
                  if (uVar8 < names->sLength) {
                    names->sLength = uVar8;
                  }
                }
                Vector::remove(nameLengths,(char *)(nameLengths->vLength - 1));
                iVar3 = 2;
                bVar14 = false;
                lVar12 = local_140;
              }
              if (lVar13 == 0) goto LAB_00108763;
            }
            if (oneByOne) {
              Vector::resetVector(sequenceInstances);
            }
            Vector::appendValue(sequenceInstances,lVar12);
            iVar3 = iVar2;
          }
        }
      }
      else {
        if ((cVar1 != '\0') || ((__c != 0x3e && (__c != 0x23)))) goto LAB_00108763;
        *automatonState = '\x01';
LAB_00108b57:
        if (sequenceInstances == (Vector *)0x0 && include_prob < 1.0) {
          uVar9 = genrand_int32();
          bVar14 = uVar9 < uVar5;
        }
      }
    }
LAB_00108763:
    if ((iVar3 != 0) && (iVar3 != 2)) {
      if (iVar3 == 3) {
        if (*automatonState != '\x02' && (!oneByOne || *automatonState != '\0')) {
          snprintf(local_138,0xff,"Unexpected end of file: state %d");
          psVar10 = (string *)__cxa_allocate_exception(0x20);
          *(string **)psVar10 = psVar10 + 0x10;
          sVar11 = strlen(local_138);
          std::__cxx11::string::_M_construct<char_const*>(psVar10,local_138,local_138 + sVar11);
          __cxa_throw(psVar10,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
        if (bVar14) {
          if (oneByOne) {
            if (*firstSequenceLength == 0) {
              *firstSequenceLength = sequences->sLength - 1;
            }
            *automatonState = '\0';
            StringBuffer::appendChar(sequences,'\0');
            funlockfile((FILE *)F);
            return 3;
          }
          addASequenceToList(sequences,seqLengths,firstSequenceLength,names,nameLengths);
        }
        *automatonState = '\x01';
        iVar3 = 0;
      }
      else {
        iVar3 = 2;
      }
      return iVar3;
    }
  } while( true );
}

Assistant:

int readFASTA (FILE* F, char& automatonState,  StringBuffer &names, 
               StringBuffer& sequences, Vector &nameLengths, Vector &seqLengths, 
               long& firstSequenceLength, bool oneByOne, 
               Vector* sequenceInstances, char sep,
               double include_prob, bool progress) {
  
  unsigned long up_to = 0L;
  
  if (oneByOne) {
    sequences.resetString();
    names.resetString();
    include_prob = 1.;
  }
  
  if (include_prob < 1.) {
    up_to = RAND_RANGE * include_prob;
  }
    
  time_t before, after;
  if (progress) {
    time(&before);
  }

  
  bool include_me = true;
  long read_counter = 0;
    
  flockfile(F);
    
  try {
  
      while (1) {
        int currentC = getc_unlocked (F);
          //cout << "State: " << int(automatonState) << "/'" << char(currentC) << "'" << endl;
        if (feof_unlocked (F))
          break;
          
        switch (automatonState) {
          case 0: {
            if (currentC == '>' || currentC == '#') {
              automatonState = 1;
              if (sequenceInstances == NULL && include_prob < 1.) {
                include_me = genrand_int32() < up_to;
              }
            }
            break;
          }
          case 1: {
            if (currentC == '\n' || currentC == '\r') {
              if (include_me) {
                  names.appendChar   ('\0');
     
                long this_name_l;
                if (oneByOne) {
                  this_name_l = names.length ()-1;
                  
                } else {
                  nameLengths.appendValue (names.length());
                  this_name_l = stringLength (nameLengths, nameLengths.length()-2);
                }

                
                if (this_name_l <= 0) {
                  throw std::string("Sequence names must be non-empty.");
                }
                automatonState = 2;

                if (sequenceInstances) {
                    unsigned long count = 1L;
                   if (this_name_l >= 3) {
                      long sep_loc = 0, ll = names.length();
                      for (sep_loc = 2; sep_loc < this_name_l; sep_loc ++) {
                        if (names.getChar(ll-sep_loc-1) == sep) {
                          break;
                        }
                      }
                      if (sep_loc < this_name_l) {
                        count = atoi (names.getString() + (ll-sep_loc));
                      }
                      if (count < 1) {
                        count = 1;
                      }
                      
                      unsigned long resampled_prob = 0UL;
                      
                      if (include_prob < 1.) {
                        for (long k = 0; k < count; k ++) {
                          resampled_prob += genrand_int32() < up_to;
                        }
                      } else {
                        resampled_prob = count;
                      }
                     
                     //cerr << count << " -> " << resampled_prob << endl;
                     
                      if (resampled_prob == 0UL) {
                        if (oneByOne) {
                          names.resetString();
                        } else {
                          names.reset_length (nameLengths.value (nameLengths.length()-2));
                        }
                        nameLengths.remove(nameLengths.length()-1);
                        include_me = false;
                        continue;
                      } else {
                        count = resampled_prob;
                      }
                      
                    }
                    if (oneByOne) {
                      sequenceInstances->resetVector();
                    }
                    sequenceInstances->appendValue(count);
                  }
               }
              
                
            }
            else {
              if (include_me) {
                names.appendChar(currentC);
              }
            }
            break;
          }
          case 2: {
            currentC = toupper (currentC);
            if (validFlags [currentC] >= 0) {
              if (include_me)
                //cout << "Append " << currentC << endl;
                sequences.appendChar (validFlags [currentC]);
            }
            else {
              if (currentC == '>' || currentC == '#') {
                automatonState = 1;
                if (include_me) {
                  if (oneByOne) {
                    if (firstSequenceLength == 0) {
                      firstSequenceLength = sequences.length()-1;
                    }
                      //cerr << endl << "Returning a sequence" << endl;
                    automatonState = 0;
                    sequences.appendChar ('\0');
                    ungetc (currentC, F);
                    funlockfile (F);
                    return 2;
                  }
                  addASequenceToList (sequences, seqLengths, firstSequenceLength, names, nameLengths);
                  read_counter++;
                  if (progress && read_counter % 1024 == 0) {
                      time(&after);
                      cerr << "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b"
                              "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b"
                              "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\bProgress"
                              ":"
                           << setw(8) << read_counter << " sequences read (" << setw(12) << std::setprecision(3)
                           << read_counter / difftime(after, before) << " seqs/sec)";

                      after = before;
                  }
                }
                if (sequenceInstances == NULL && include_prob < 1.) {
                  include_me = genrand_int32() < up_to;
                } else {
                  include_me = true;
                }
                  
              }
            }
            break;
          }
        }
      }
      
      if (automatonState == 2 || (oneByOne && automatonState == 0)) {
          if (include_me) {
              if (oneByOne) {
                  if (firstSequenceLength == 0) {
                      firstSequenceLength = sequences.length()-1;
                  }
                  automatonState = 0;
                  sequences.appendChar ('\0');
                  funlockfile (F);
                  return 3;
              } else {
                  addASequenceToList (sequences, seqLengths, firstSequenceLength, names, nameLengths);
              }
          }
          automatonState = 1;
      } else {
        char err[256] ;
        snprintf (err, 255, "Unexpected end of file: state %d", automatonState);
        throw std::string(err);
      }
  } catch (std::string const err) {
      cerr << err << endl;
      funlockfile (F);
      return 1;
  }
  return 0;
}